

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O0

OPTIONHANDLER_HANDLE
telemetry_messenger_retrieve_options(TELEMETRY_MESSENGER_HANDLE messenger_handle)

{
  OPTIONHANDLER_RESULT OVar1;
  LOGGER_LOG p_Var2;
  OPTIONHANDLER_HANDLE handle;
  LOGGER_LOG l_2;
  TELEMETRY_MESSENGER_INSTANCE_conflict *instance;
  LOGGER_LOG l_1;
  OPTIONHANDLER_HANDLE options;
  LOGGER_LOG l;
  OPTIONHANDLER_HANDLE result;
  TELEMETRY_MESSENGER_HANDLE messenger_handle_local;
  
  if (messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                ,"telemetry_messenger_retrieve_options",0x7e5,1,
                "Failed to retrieve options from messenger instance (messenger_handle is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    handle = OptionHandler_Create
                       (telemetry_messenger_clone_option,telemetry_messenger_destroy_option,
                        telemetry_messenger_set_option);
    if (handle == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                  ,"telemetry_messenger_retrieve_options",0x7ee,1,
                  "Failed to retrieve options from messenger instance (OptionHandler_Create failed)"
                 );
      }
      l = (LOGGER_LOG)0x0;
    }
    else {
      OVar1 = OptionHandler_AddOption
                        (handle,"telemetry_event_send_timeout_secs",
                         &messenger_handle->event_send_timeout_secs);
      l = (LOGGER_LOG)handle;
      if (OVar1 != OPTIONHANDLER_OK) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                    ,"telemetry_messenger_retrieve_options",0x7f7,1,
                    "Failed to retrieve options from messenger instance (OptionHandler_Create failed for option \'%s\')"
                    ,"telemetry_event_send_timeout_secs");
        }
        l = (LOGGER_LOG)0x0;
      }
      if (l == (LOGGER_LOG)0x0) {
        OptionHandler_Destroy(handle);
      }
    }
  }
  return (OPTIONHANDLER_HANDLE)l;
}

Assistant:

OPTIONHANDLER_HANDLE telemetry_messenger_retrieve_options(TELEMETRY_MESSENGER_HANDLE messenger_handle)
{
    OPTIONHANDLER_HANDLE result;

    if (messenger_handle == NULL)
    {
        LogError("Failed to retrieve options from messenger instance (messenger_handle is NULL)");
        result = NULL;
    }
    else
    {
        OPTIONHANDLER_HANDLE options = OptionHandler_Create(telemetry_messenger_clone_option, telemetry_messenger_destroy_option, (pfSetOption)telemetry_messenger_set_option);

        if (options == NULL)
        {
            LogError("Failed to retrieve options from messenger instance (OptionHandler_Create failed)");
            result = NULL;
        }
        else
        {
            TELEMETRY_MESSENGER_INSTANCE* instance = (TELEMETRY_MESSENGER_INSTANCE*)messenger_handle;

            if (OptionHandler_AddOption(options, TELEMETRY_MESSENGER_OPTION_EVENT_SEND_TIMEOUT_SECS, (void*)&instance->event_send_timeout_secs) != OPTIONHANDLER_OK)
            {
                LogError("Failed to retrieve options from messenger instance (OptionHandler_Create failed for option '%s')", TELEMETRY_MESSENGER_OPTION_EVENT_SEND_TIMEOUT_SECS);
                result = NULL;
            }
            else
            {
                result = options;
            }

            if (result == NULL)
            {
                OptionHandler_Destroy(options);
            }
        }
    }

    return result;
}